

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDFace::GetEdgeArray(ON_SubDFace *this,ON_SimpleArray<ON_SubDEdgePtr> *face_edge_array)

{
  uint uVar1;
  uint local_34;
  uint local_20;
  uint fei;
  uint edge_count;
  ON_SimpleArray<ON_SubDEdgePtr> *face_edge_array_local;
  ON_SubDFace *this_local;
  
  ON_SimpleArray<ON_SubDEdgePtr>::SetCount(face_edge_array,0);
  uVar1 = (uint)this->m_edge_count;
  ON_SimpleArray<ON_SubDEdgePtr>::Reserve(face_edge_array,(ulong)uVar1);
  local_34 = uVar1;
  if (4 < uVar1) {
    local_34 = 4;
  }
  ON_SimpleArray<ON_SubDEdgePtr>::Append(face_edge_array,local_34,this->m_edge4);
  if (4 < uVar1) {
    if (this->m_edgex == (ON_SubDEdgePtr *)0x0) {
      for (local_20 = 4; local_20 < uVar1; local_20 = local_20 + 1) {
        ON_SimpleArray<ON_SubDEdgePtr>::Append(face_edge_array,&ON_SubDEdgePtr::Null);
      }
    }
    else {
      ON_SimpleArray<ON_SubDEdgePtr>::Append(face_edge_array,uVar1 - 4,this->m_edgex);
    }
  }
  return uVar1;
}

Assistant:

unsigned int ON_SubDFace::GetEdgeArray(
  ON_SimpleArray< ON_SubDEdgePtr >& face_edge_array
) const
{
  face_edge_array.SetCount(0);
  const unsigned edge_count = m_edge_count;
  face_edge_array.Reserve(edge_count);
  face_edge_array.Append(edge_count <= 4 ? edge_count : 4U, m_edge4);
  if (edge_count > 4)
  {
    if ( nullptr != m_edgex )
     face_edge_array.Append(edge_count-4U, m_edgex);
    else
    {
      for (unsigned fei = 4; fei < edge_count; ++fei)
        face_edge_array.Append(ON_SubDEdgePtr::Null);
    }
  }
  return edge_count;
}